

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase1162::run(TestCase1162 *this)

{
  Fault node;
  PromiseArenaMember *node_00;
  Disposer *node_01;
  long *plVar1;
  size_t sVar2;
  int iVar3;
  undefined8 *puVar4;
  MonotonicClock *pMVar5;
  undefined4 extraout_var;
  char *pcVar6;
  long *in_R8;
  Fault f;
  OwnFd originalDirFd;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>
  _kjDefer1175;
  Own<kj::NetworkAddress,_std::nullptr_t> addr;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  String address;
  AsyncIoContext ioContext;
  Fault local_f8;
  OwnFd local_ec;
  PromiseArenaMember *local_e8;
  anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>_2
  aStack_e0;
  Own<kj::ConnectionReceiver,_std::nullptr_t> local_d0;
  long *local_c0;
  undefined8 *local_b8;
  long *local_b0;
  String local_a8;
  undefined8 *local_90;
  long *local_88;
  undefined8 *local_80;
  long *local_78;
  PromiseBase local_60;
  long *local_58;
  char *local_50;
  char *pcStack_48;
  undefined8 local_40;
  char *local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  setupAsyncIo();
  puVar4 = (undefined8 *)(**(code **)(*local_78 + 0x18))();
  pMVar5 = systemPreciseMonotonicClock();
  iVar3 = (**pMVar5->_vptr_MonotonicClock)(pMVar5);
  local_d0.ptr._0_4_ = getpid();
  local_e8 = (PromiseArenaMember *)CONCAT44(extraout_var,iVar3);
  str<char_const(&)[18],int,long>
            (&local_a8,(kj *)"unix-abstract:foo",(char (*) [18])&local_d0.ptr,(int *)&local_e8,in_R8
            );
  pcVar6 = local_a8.content.ptr;
  if (local_a8.content.size_ == 0) {
    pcVar6 = "";
  }
  (**(code **)*puVar4)
            (&local_e8,puVar4,pcVar6,local_a8.content.size_ + (local_a8.content.size_ == 0),0);
  local_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_30 = "run";
  local_28 = 0x1e00000490;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&local_d0.ptr,&local_e8);
  node_00 = local_e8;
  if (local_e8 != (PromiseArenaMember *)0x0) {
    local_e8 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node_00);
  }
  (**(code **)(*local_c0 + 0x10))(&local_b8);
  do {
    local_ec.fd = open(".",0x90000);
    if (-1 < local_ec.fd) goto LAB_00220d60;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    local_f8.exception = (Exception *)0x0;
    local_e8 = (PromiseArenaMember *)0x0;
    aStack_e0 = (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>_2
                 )0x0;
    kj::_::Debug::Fault::init
              (&local_f8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_f8);
  }
LAB_00220d60:
  do {
    iVar3 = chdir("/");
    if (-1 < iVar3) goto LAB_00220d80;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    local_f8.exception = (Exception *)0x0;
    local_e8 = (PromiseArenaMember *)0x0;
    aStack_e0 = (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>_2
                 )0x0;
    kj::_::Debug::Fault::init
              (&local_f8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_f8);
  }
LAB_00220d80:
  local_e8 = (PromiseArenaMember *)CONCAT71(local_e8._1_7_,1);
  aStack_e0 = (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>_2
               )&local_ec;
  (**(code **)*local_c0)(&local_d0);
  Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
  attach<kj::Own<kj::ConnectionReceiver,decltype(nullptr)>>
            ((Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)&local_f8,&local_d0);
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_48 = "run";
  local_40 = 0x300000499;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_60,&local_f8);
  plVar1 = local_58;
  if (local_58 != (long *)0x0) {
    local_58 = (long *)0x0;
    (*(code *)**(undefined8 **)local_60.node.ptr)
              (local_60.node.ptr,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  node.exception = local_f8.exception;
  if (local_f8.exception != (Exception *)0x0) {
    local_f8.exception = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
  }
  node_01 = local_d0.disposer;
  if ((PromiseArenaMember *)local_d0.disposer != (PromiseArenaMember *)0x0) {
    local_d0.disposer = (Disposer *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_01);
  }
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:1175:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>
               *)&local_e8);
  OwnFd::~OwnFd(&local_ec);
  plVar1 = local_b0;
  if (local_b0 != (long *)0x0) {
    local_b0 = (long *)0x0;
    (**(code **)*local_b8)(local_b8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  plVar1 = local_c0;
  if (local_c0 != (long *)0x0) {
    local_c0 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_d0.ptr._4_4_,(__pid_t)local_d0.ptr))
              ((undefined8 *)CONCAT44(local_d0.ptr._4_4_,(__pid_t)local_d0.ptr),
               (long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  sVar2 = local_a8.content.size_;
  pcVar6 = local_a8.content.ptr;
  if (local_a8.content.ptr != (char *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar6,1,sVar2,sVar2,0);
  }
  plVar1 = local_78;
  if (local_78 != (long *)0x0) {
    local_78 = (long *)0x0;
    (**(code **)*local_80)(local_80,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  plVar1 = local_88;
  if (local_88 != (long *)0x0) {
    local_88 = (long *)0x0;
    (**(code **)*local_90)(local_90,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, AbstractUnixSocket) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();
  auto elapsedSinceEpoch = systemPreciseMonotonicClock().now() - kj::origin<TimePoint>();
  auto address = kj::str("unix-abstract:foo", getpid(), elapsedSinceEpoch / kj::NANOSECONDS);

  Own<NetworkAddress> addr = network.parseAddress(address).wait(ioContext.waitScope);

  Own<ConnectionReceiver> listener = addr->listen();
  // chdir proves no filesystem dependence. Test fails for regular unix socket
  // but passes for abstract unix socket.
  auto originalDirFd = KJ_SYSCALL_FD(open(".", O_RDONLY | O_DIRECTORY | O_CLOEXEC));
  KJ_SYSCALL(chdir("/"));
  KJ_DEFER(KJ_SYSCALL(fchdir(originalDirFd)));

  addr->connect().attach(kj::mv(listener)).wait(ioContext.waitScope);
}